

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

Gia_Man_t * Ifn_ManStrFindCofactors(int nIns,Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  char *__s;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *__dest;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  Gia_Man_t *pGVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  
  uVar14 = 1 << ((byte)nIns & 0x1f);
  p_00 = Gia_ManStart(p->nObjs);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar9 = strlen(__s);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar16 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar16];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_003a78a5:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (nIns <= lVar16) {
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar13 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar13 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_003a7902:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = p_00->pObjs;
        if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_003a7902;
        pGVar3[iVar7].Value = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
        pVVar11 = p->vCis;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar11->nSize);
  }
  if (nIns != 0x1f) {
    uVar6 = 1;
    if (1 < (int)uVar14) {
      uVar6 = uVar14;
    }
    uVar14 = 0;
    do {
      lVar16 = (long)p->vCis->nSize;
      if (lVar16 < 1) {
        iVar7 = p->nObjs;
        if (0 < iVar7) goto LAB_003a7731;
      }
      else {
        piVar5 = p->vCis->pArray;
        lVar15 = 0;
        do {
          iVar1 = piVar5[lVar15];
          if (((long)iVar1 < 0) || (iVar7 = p->nObjs, iVar7 <= iVar1)) goto LAB_003a78a5;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (lVar15 < nIns) {
            p->pObjs[iVar1].Value = (uint)((uVar14 >> ((uint)lVar15 & 0x1f) & 1) != 0);
          }
          lVar15 = lVar15 + 1;
        } while (lVar16 != lVar15);
LAB_003a7731:
        lVar16 = 8;
        lVar15 = 0;
        do {
          pGVar3 = p->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar13 = *(ulong *)((long)pGVar3 + lVar16 + -8);
          if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
            uVar8 = *(uint *)((long)pGVar3 +
                             lVar16 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
            if (((int)uVar8 < 0) ||
               (uVar2 = *(uint *)((long)pGVar3 +
                                 lVar16 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar2 < 0)) goto LAB_003a78c4;
            iVar7 = Gia_ManHashAnd(p_00,uVar8 ^ (uint)(uVar13 >> 0x1d) & 1,
                                   uVar2 ^ (uint)(uVar13 >> 0x3d) & 1);
            *(int *)(&pGVar3->field_0x0 + lVar16) = iVar7;
            iVar7 = p->nObjs;
          }
          lVar15 = lVar15 + 1;
          lVar16 = lVar16 + 0xc;
        } while (lVar15 < iVar7);
      }
      pVVar11 = p->vCos;
      uVar13 = (ulong)(uint)pVVar11->nSize;
      if (p->nRegs < pVVar11->nSize) {
        lVar16 = 0;
        do {
          if ((int)uVar13 <= lVar16) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar7 = pVVar11->pArray[lVar16];
          if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_003a78a5;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = p->pObjs + iVar7;
          if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
LAB_003a78c4:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10f,"int Abc_LitNotCond(int, int)");
          }
          uVar8 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                       pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].
                                       Value);
          pGVar3->Value = uVar8;
          lVar16 = lVar16 + 1;
          pVVar11 = p->vCos;
          uVar13 = (ulong)pVVar11->nSize;
        } while (lVar16 < (long)(uVar13 - (long)p->nRegs));
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar6);
  }
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

Gia_Man_t * Ifn_ManStrFindCofactors( int nIns, Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp; 
    Gia_Obj_t * pObj;
    int i, m, nMints = 1 << nIns;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( i >= nIns )
            pObj->Value = Gia_ManAppendCi( pNew );
    for ( m = 0; m < nMints; m++ )
    {
        Gia_ManForEachCi( p, pObj, i )
            if ( i < nIns )
                pObj->Value = ((m >> i) & 1);
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}